

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
::_update_entry(List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
                *this,Field_element *value,ID_index rowIndex,iterator *position)

{
  Matrix_entry *entry;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  *pEVar1;
  ID_index local_24;
  
  local_24 = rowIndex;
  pEVar1 = New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
           ::construct<unsigned_int&,unsigned_int&>
                     ((New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
                       *)this->entryPool_,(uint *)this,&local_24);
  position->_M_node[1]._M_next = (_List_node_base *)pEVar1;
  entry = (Matrix_entry *)position->_M_node[1]._M_next;
  (entry->super_Entry_field_element_option).element_ = *value;
  Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  ::insert_entry(&this->super_Row_access_option,local_24,entry);
  return;
}

Assistant:

inline void List_column<Master_matrix>::_update_entry(const Field_element& value,
                                                      ID_index rowIndex,
                                                      const typename Column_support::iterator& position)
{
  if constexpr (Master_matrix::Option_list::has_row_access) {
    *position = entryPool_->construct(RA_opt::columnIndex_, rowIndex);
    (*position)->set_element(value);
    RA_opt::insert_entry(rowIndex, *position);
  } else {
    *position = entryPool_->construct(rowIndex);
    (*position)->set_element(value);
  }
}